

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::TestGroup::TestGroup(TestGroup *this,Context *ctx)

{
  FormatExtEntries extRange_00;
  FormatEntries fmtRange;
  bool have;
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *this_00;
  FormatExtEntries extRange;
  FormatEntries stdRange;
  Context *ctx_local;
  TestGroup *this_local;
  
  TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,ctx,"completeness","Completeness tests");
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestGroup_03281898;
  (this->m_checkerFactory).super_CheckerFactory._vptr_CheckerFactory = (_func_int **)0x0;
  ES2CheckerFactory::ES2CheckerFactory(&this->m_checkerFactory);
  testCtx = gles2::Context::getTestContext(ctx);
  renderCtx = gles2::Context::getRenderContext(ctx);
  deqp::gls::fboc::details::Context::Context
            (&this->m_fboc,testCtx,renderCtx,&(this->m_checkerFactory).super_CheckerFactory);
  fmtRange.m_end =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)s_es2ExtFormats;
  fmtRange.m_begin =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)s_es2Formats;
  deqp::gls::fboc::details::Context::addFormats(&this->m_fboc,fmtRange);
  extRange_00.m_end = (FormatExtEntry *)Performance::ShaderOperatorTests::init::functionCaseGroups;
  extRange_00.m_begin = (FormatExtEntry *)s_es2ExtFormats;
  deqp::gls::fboc::details::Context::addExtFormats(&this->m_fboc,extRange_00);
  this_00 = gles2::Context::getContextInfo(ctx);
  have = glu::ContextInfo::isExtensionSupported(this_00,"GL_NV_fbo_color_attachments");
  deqp::gls::fboc::details::Context::setHaveMulticolorAtts(&this->m_fboc,have);
  return;
}

Assistant:

TestGroup::TestGroup (Context& ctx)
	: TestCaseGroup		(ctx, "completeness", "Completeness tests")
	, m_checkerFactory	()
	, m_fboc			(ctx.getTestContext(), ctx.getRenderContext(), m_checkerFactory)
{
	const FormatEntries stdRange = GLS_ARRAY_RANGE(s_es2Formats);
	const FormatExtEntries extRange = GLS_ARRAY_RANGE(s_es2ExtFormats);

	m_fboc.addFormats(stdRange);
	m_fboc.addExtFormats(extRange);
	m_fboc.setHaveMulticolorAtts(
		ctx.getContextInfo().isExtensionSupported("GL_NV_fbo_color_attachments"));
}